

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

int __thiscall sptk::swipe::sieve(swipe *this,intvector ones)

{
  int iVar1;
  long lVar2;
  undefined4 *puVar3;
  undefined4 *puVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined4 *puVar11;
  double dVar12;
  
  puVar4 = ones._0_8_;
  iVar6 = (int)this;
  dVar12 = (double)iVar6;
  if (dVar12 < 0.0) {
    dVar12 = sqrt(dVar12);
  }
  else {
    dVar12 = SQRT(dVar12);
  }
  dVar12 = floor(dVar12);
  *puVar4 = 0;
  lVar2 = (long)(int)dVar12;
  puVar3 = puVar4 + 3;
  iVar1 = 0;
  lVar7 = 8;
  iVar8 = 3;
  iVar9 = 2;
  for (lVar5 = 1; lVar5 < lVar2; lVar5 = lVar5 + 1) {
    puVar11 = puVar3;
    iVar10 = iVar8;
    if (puVar4[lVar5] == 1) {
      for (; iVar10 < iVar6; iVar10 = iVar10 + iVar9) {
        *puVar11 = 0;
        puVar11 = (undefined4 *)((long)puVar11 + lVar7);
      }
      iVar1 = iVar1 + 1;
    }
    puVar3 = puVar3 + 2;
    lVar7 = lVar7 + 4;
    iVar8 = iVar8 + 2;
    iVar9 = iVar9 + 1;
  }
  for (; lVar2 < iVar6; lVar2 = lVar2 + 1) {
    iVar1 = iVar1 + (uint)(puVar4[lVar2] == 1);
  }
  return iVar1;
}

Assistant:

int sieve(intvector ones) {
    int k = 0;
    int sp = floor(sqrt(ones.x));
    int i, j;
    ones.v[0] = NP; // 1 is not prime, though sometimes I wish it was
    for (i = 1; i < sp; i++) {
        if PRIME(ones.v[i]) {
            for (j = i + i + 1; j < ones.x; j += i + 1)
                ones.v[j] = NP;
            k++;
        }
    }
    for (i = sp; i < ones.x; i++) { // now we're only counting
        if PRIME(ones.v[i])
            k++;
    }
    return(k);
}